

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O0

bool spvIsOpenCLEnv(spv_target_env_conflict env)

{
  bool local_9;
  spv_target_env_conflict env_local;
  
  switch(env) {
  case SPV_ENV_UNIVERSAL_1_0:
  case SPV_ENV_VULKAN_1_0:
  case SPV_ENV_UNIVERSAL_1_1:
  case SPV_ENV_OPENGL_4_0:
  case NonSemanticClspvReflectionRevision:
  case SPV_ENV_OPENGL_4_2:
  case SPV_ENV_OPENGL_4_3:
  case SPV_ENV_OPENGL_4_5:
  case SPV_ENV_UNIVERSAL_1_2:
  case SPV_ENV_UNIVERSAL_1_3:
  case SPV_ENV_VULKAN_1_1:
  case SPV_ENV_UNIVERSAL_1_4:
  case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
  case SPV_ENV_UNIVERSAL_1_5:
  case SPV_ENV_VULKAN_1_2:
  case SPV_ENV_UNIVERSAL_1_6:
  case SPV_ENV_VULKAN_1_3:
  case SPV_ENV_VULKAN_1_4:
    local_9 = false;
    break;
  case SPV_ENV_OPENCL_2_1:
  case SPV_ENV_OPENCL_2_2:
  case SPV_ENV_OPENCL_1_2:
  case SPV_ENV_OPENCL_EMBEDDED_1_2:
  case SPV_ENV_OPENCL_2_0:
  case CODESET:
  case SPV_ENV_OPENCL_EMBEDDED_2_1:
  case SPV_ENV_OPENCL_EMBEDDED_2_2:
    local_9 = true;
    break;
  case SPV_ENV_WEBGPU_0:
    __assert_fail("false && \"Deprecated target environment value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/spirv_target_env.cpp"
                  ,0x15a,"bool spvIsOpenCLEnv(spv_target_env)");
  case SPV_ENV_MAX:
    __assert_fail("false && \"Invalid target environment value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/spirv_target_env.cpp"
                  ,0x15d,"bool spvIsOpenCLEnv(spv_target_env)");
  default:
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool spvIsOpenCLEnv(spv_target_env env) {
  switch (env) {
    case SPV_ENV_UNIVERSAL_1_0:
    case SPV_ENV_VULKAN_1_0:
    case SPV_ENV_UNIVERSAL_1_1:
    case SPV_ENV_OPENGL_4_0:
    case SPV_ENV_OPENGL_4_1:
    case SPV_ENV_OPENGL_4_2:
    case SPV_ENV_OPENGL_4_3:
    case SPV_ENV_OPENGL_4_5:
    case SPV_ENV_UNIVERSAL_1_2:
    case SPV_ENV_UNIVERSAL_1_3:
    case SPV_ENV_VULKAN_1_1:
    case SPV_ENV_UNIVERSAL_1_4:
    case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
    case SPV_ENV_UNIVERSAL_1_5:
    case SPV_ENV_VULKAN_1_2:
    case SPV_ENV_UNIVERSAL_1_6:
    case SPV_ENV_VULKAN_1_3:
    case SPV_ENV_VULKAN_1_4:
      return false;
    case SPV_ENV_OPENCL_1_2:
    case SPV_ENV_OPENCL_EMBEDDED_1_2:
    case SPV_ENV_OPENCL_2_0:
    case SPV_ENV_OPENCL_EMBEDDED_2_0:
    case SPV_ENV_OPENCL_EMBEDDED_2_1:
    case SPV_ENV_OPENCL_EMBEDDED_2_2:
    case SPV_ENV_OPENCL_2_1:
    case SPV_ENV_OPENCL_2_2:
      return true;
    case SPV_ENV_WEBGPU_0:
      assert(false && "Deprecated target environment value.");
      break;
    case SPV_ENV_MAX:
      assert(false && "Invalid target environment value.");
      break;
  }
  return false;
}